

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

StructBuilder * __thiscall
capnp::_::OrphanBuilder::asStruct
          (StructBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  CapTableBuilder *capTable;
  BuilderArena *pBVar4;
  word *pwVar5;
  ushort uVar6;
  SegmentBuilder *this_00;
  SegmentBuilder *pSVar7;
  SegmentBuilder *pSVar8;
  undefined8 *puVar9;
  ushort uVar10;
  word *pwVar11;
  OrphanBuilder *pOVar12;
  WirePointer *dst;
  uint uVar13;
  WirePointer *src;
  StructSize SVar14;
  StructSize SVar15;
  uint uVar16;
  ulong uVar17;
  word *result;
  ushort uVar18;
  WirePointer *pWVar19;
  bool bVar20;
  AllocateResult AVar21;
  AllocateResult AVar22;
  AllocateResult AVar23;
  uint local_60;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  pSVar8 = this->segment;
  capTable = this->capTable;
  pBVar4 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
  uVar13 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  uVar18 = size.data;
  uVar10 = size.pointers;
  if (id.value != 0 || uVar13 != 0) {
    if ((uVar13 & 3) == 2) {
      this_00 = BuilderArena::getSegment(pBVar4,id);
      uVar13 = (uint)(this->tag).content;
      pwVar11 = (this_00->super_SegmentReader).ptr.ptr;
      uVar17 = (ulong)(uVar13 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar11->content + uVar17);
      pOVar12 = (OrphanBuilder *)((long)&pwVar11[1].content + uVar17);
      if ((uVar13 & 4) == 0) {
        pwVar11 = &pOVar12->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar12 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar11 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                          (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar11 = this->location;
      this_00 = pSVar8;
      pOVar12 = this;
    }
    AVar23.words = pwVar11;
    AVar23.segment = this_00;
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.right = STRUCT;
    _kjCondition.left = (Kind)(pOVar12->tag).content & OTHER;
    _kjCondition.result = _kjCondition.left == STRUCT;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) {
      uVar2 = *(ushort *)((long)&(pOVar12->tag).content + 4);
      uVar3 = *(ushort *)((long)&(pOVar12->tag).content + 6);
      src = (WirePointer *)(pwVar11 + uVar2);
      SVar14.pointers = 0;
      SVar14.data = uVar2;
      pWVar19 = src;
      uVar6 = uVar3;
      if (uVar3 < uVar10 || uVar2 < uVar18) {
        SVar15 = SVar14;
        if (uVar2 <= uVar18) {
          SVar15 = size;
        }
        uVar13 = (uint)size >> 0x10;
        if (uVar10 < uVar3) {
          uVar13 = (uint)uVar3;
        }
        SVar14 = (StructSize)((uint)SVar15 & 0xffff);
        if ((((this->tag).content & 3) == 2) &&
           (pSVar7 = BuilderArena::getSegment
                               ((BuilderArena *)(pSVar8->super_SegmentReader).arena,
                                (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
           pSVar7->readOnly == false)) {
          uVar16 = (uint)(this->tag).content;
          puVar9 = (undefined8 *)
                   ((long)&((pSVar7->super_SegmentReader).ptr.ptr)->content +
                   (ulong)(uVar16 & 0xfffffff8));
          if ((uVar16 & 4) == 0) {
            *puVar9 = 0;
          }
          else {
            *puVar9 = 0;
            puVar9[1] = 0;
          }
        }
        uVar16 = uVar13 + (int)SVar14;
        (this->tag).content = 0;
        pOVar12 = this;
        if (pBVar4 == (BuilderArena *)0x0) {
          if (uVar16 == 0) {
            AVar23.words = &this->tag;
            AVar23.segment = pSVar8;
            *(undefined4 *)&(this->tag).content = 0xfffffffc;
          }
          else {
            pwVar5 = pSVar8->pos;
            AVar23.words = pwVar5;
            AVar23.segment = pSVar8;
            if (((long)((long)(pSVar8->super_SegmentReader).ptr.ptr +
                       ((pSVar8->super_SegmentReader).ptr.size_ * 8 - (long)pwVar5)) >> 3 <
                 (long)(ulong)uVar16) || (pSVar8->pos = pwVar5 + uVar16, pwVar5 == (word *)0x0)) {
              pBVar4 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
              uVar16 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                                 (uVar16 + 1,(anon_class_1_0_00000001 *)&_kjCondition);
              AVar23 = BuilderArena::allocate(pBVar4,uVar16);
              pOVar12 = (OrphanBuilder *)AVar23.words;
              pSVar8 = AVar23.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar23.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar8->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar12->tag).content = 0;
              AVar23.words = (word *)&pOVar12->segment;
              AVar23.segment = pSVar8;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar5 - (long)this) >> 1) & 0xfffffffc) - 4;
            }
          }
        }
        else {
          AVar23 = BuilderArena::allocate(pBVar4,uVar16);
          *(undefined4 *)&(this->tag).content = 0xfffffffc;
        }
        uVar17 = (ulong)uVar3;
        *(StructDataWordCount *)((long)&(pOVar12->tag).content + 4) = SVar15.data;
        uVar6 = (ushort)uVar13;
        *(ushort *)((long)&(pOVar12->tag).content + 6) = uVar6;
        if (uVar2 != 0) {
          memcpy(AVar23.words,pwVar11,(ulong)uVar2 << 3);
        }
        pWVar19 = (WirePointer *)(AVar23.words + ((uint)SVar15 & 0xffff));
        dst = pWVar19;
        while (bVar20 = uVar17 != 0, uVar17 = uVar17 - 1, bVar20) {
          WireHelpers::transferPointer(AVar23.segment,dst,this_00,src);
          dst = dst + 1;
          src = src + 1;
        }
        local_60 = (uint)uVar2;
        if (uVar3 + local_60 != 0) {
          memset(pwVar11,0,(ulong)((uVar3 + local_60) * 8));
        }
      }
      goto LAB_0018085a;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[88]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x47b,FAILED,"oldRef->kind() == WirePointer::STRUCT",
               "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer was expected.\""
               ,&_kjCondition,
               (char (*) [88])
               "Schema mismatch: Message contains non-struct pointer where struct pointer was expected."
              );
    kj::_::Debug::Fault::~Fault(&f);
  }
  SVar14 = (StructSize)((uint)size & 0xffff);
  uVar13 = ((uint)size >> 0x10) + (int)SVar14;
  if (pBVar4 == (BuilderArena *)0x0) {
    if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
      WireHelpers::zeroObject(pSVar8,capTable,(WirePointer *)this);
    }
    if (uVar13 == 0) {
      *(undefined4 *)&(this->tag).content = 0xfffffffc;
      AVar22.words = &this->tag;
      AVar22.segment = pSVar8;
      pOVar12 = this;
    }
    else {
      pwVar11 = pSVar8->pos;
      AVar21.words = pwVar11;
      AVar21.segment = pSVar8;
      if (((long)(ulong)uVar13 <=
           (long)((long)(pSVar8->super_SegmentReader).ptr.ptr +
                 ((pSVar8->super_SegmentReader).ptr.size_ * 8 - (long)pwVar11)) >> 3) &&
         (pSVar8->pos = pwVar11 + uVar13, pwVar11 != (word *)0x0)) {
        *(uint *)&(this->tag).content =
             ((uint)((ulong)((long)pwVar11 - (long)this) >> 1) & 0xfffffffc) - 4;
        goto LAB_00180843;
      }
      pBVar4 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
      uVar13 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                         (uVar13 + 1,(anon_class_1_0_00000001 *)&_kjCondition);
      AVar22 = BuilderArena::allocate(pBVar4,uVar13);
      *(uint *)&(this->tag).content =
           (int)AVar22.words - *(int *)&((AVar22.segment)->super_SegmentReader).ptr.ptr &
           0xfffffff8U | 2;
      *(uint *)((long)&(this->tag).content + 4) = ((AVar22.segment)->super_SegmentReader).id.value;
      *(undefined4 *)&(AVar22.words)->content = 0;
      pOVar12 = (OrphanBuilder *)(AVar22.words + 1);
    }
  }
  else {
    AVar21 = BuilderArena::allocate(pBVar4,uVar13);
    *(undefined4 *)&(this->tag).content = 0xfffffffc;
LAB_00180843:
    AVar22.words = &this->tag;
    AVar22.segment = AVar21.segment;
    pOVar12 = (OrphanBuilder *)AVar21.words;
  }
  AVar23.words = &pOVar12->tag;
  AVar23.segment = AVar22.segment;
  *(ushort *)((long)&(AVar22.words)->content + 4) = uVar18;
  *(ushort *)((long)&(AVar22.words)->content + 6) = uVar10;
  pWVar19 = (WirePointer *)(&pOVar12->tag + (uint)SVar14);
  uVar6 = uVar10;
LAB_0018085a:
  __return_storage_ptr__->segment = AVar23.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->data = AVar23.words;
  __return_storage_ptr__->pointers = pWVar19;
  __return_storage_ptr__->dataSize = (int)SVar14 << 6;
  __return_storage_ptr__->pointerCount = uVar6;
  this->location = AVar23.words;
  return __return_storage_ptr__;
}

Assistant:

StructBuilder OrphanBuilder::asStruct(StructSize size) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  StructBuilder result = WireHelpers::getWritableStructPointer(
      tagAsPtr(), location, segment, capTable, size, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = reinterpret_cast<word*>(result.data);

  return result;
}